

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode * Cudd_bddComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  DdNode *pDVar1;
  ulong uVar2;
  ulong uVar3;
  DdNode *g;
  
  pDVar1 = dd->one;
  uVar3 = (ulong)pDVar1 & 0xfffffffffffffffe;
  *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
  if (0 < n) {
    uVar2 = (ulong)(uint)n + 1;
    g = pDVar1;
    do {
      if ((phase == (int *)0x0) || (phase[uVar2 - 2] != 0)) {
        pDVar1 = vars[uVar2 - 2];
      }
      else {
        pDVar1 = (DdNode *)((ulong)vars[uVar2 - 2] ^ 1);
      }
      pDVar1 = Cudd_bddAnd(dd,pDVar1,g);
      if (pDVar1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      uVar3 = (ulong)pDVar1 & 0xfffffffffffffffe;
      *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
      Cudd_RecursiveDeref(dd,g);
      uVar2 = uVar2 - 1;
      g = pDVar1;
    } while (1 < uVar2);
  }
  *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + -1;
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_bddAnd(dd,vars[i],cube);
        } else {
            fn = Cudd_bddAnd(dd,Cudd_Not(vars[i]),cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}